

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeF64Const
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,double c)

{
  Literal local_70;
  Result<wasm::Ok> local_58;
  double local_30;
  double c_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  ParseDefsCtx *pPStack_18;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  local_30 = c;
  c_local = (double)annotations;
  annotations_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseDefsCtx *)__return_storage_ptr__;
  wasm::Literal::Literal(&local_70,c);
  IRBuilder::makeConst(&local_58,&this->irBuilder,&local_70);
  withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_58);
  Result<wasm::Ok>::~Result(&local_58);
  wasm::Literal::~Literal(&local_70);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeF64Const(Index pos,
                        const std::vector<Annotation>& annotations,
                        double c) {
    return withLoc(pos, irBuilder.makeConst(Literal(c)));
  }